

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void limit_function_call_results(ParserState *parser,int num_lhs,AstNodeList *expr_list)

{
  int iVar1;
  AstNode *pAVar2;
  undefined4 in_register_00000034;
  
  pAVar2 = (AstNode *)raviX_ptrlist_last((PtrList *)CONCAT44(in_register_00000034,num_lhs));
  pAVar2 = has_function_call(pAVar2);
  if (pAVar2 != (AstNode *)0x0) {
    iVar1 = raviX_ptrlist_size((PtrList *)CONCAT44(in_register_00000034,num_lhs));
    if (iVar1 < (int)parser) {
      (pAVar2->field_2).function_call_expr.num_results = ((int)parser - iVar1) + 1;
    }
  }
  return;
}

Assistant:

static void limit_function_call_results(ParserState *parser, int num_lhs, AstNodeList *expr_list)
{
	// FIXME probably doesn't handle var arg case
	AstNode *last_expr = (AstNode *)raviX_ptrlist_last((PtrList *)expr_list);
	AstNode *call_expr = has_function_call(last_expr);
	if (!call_expr)
		return;
	int num_expr = raviX_ptrlist_size((const PtrList *)expr_list);
	if (num_expr < num_lhs) {
		call_expr->function_call_expr.num_results = (num_lhs - num_expr) + 1;
	}
}